

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void regenerateIndices(void)

{
  int iVar1;
  int phi_i;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_> triangles;
  allocator_type local_21;
  _Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_> local_20;
  
  std::vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>::vector
            ((vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_> *)&local_20
             ,(ulong)(uint)((int)phi_n * (int)theta_n * 2),&local_21);
  lVar5 = 0;
  for (uVar2 = 0; uVar2 < CONCAT44(phi_n._4_4_,(int)phi_n); uVar2 = uVar2 + 1) {
    lVar3 = lVar5 * 0xc;
    for (uVar4 = 0; uVar4 < CONCAT44(theta_n._4_4_,(int)theta_n); uVar4 = uVar4 + 1) {
      iVar7 = ((int)theta_n + 1) * (int)uVar2;
      iVar1 = (int)uVar4;
      iVar9 = iVar1 + iVar7 + 1;
      iVar8 = iVar7 + (int)theta_n;
      iVar6 = iVar1 + iVar8 + 1;
      *(int *)((long)&(local_20._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar3) = iVar9;
      *(int *)((long)&(local_20._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar3 + 4) =
           iVar1 + iVar7;
      *(int *)((long)&(local_20._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar3 + 8) =
           iVar6;
      lVar5 = lVar5 + 2;
      *(int *)((long)&local_20._M_impl.super__Vector_impl_data._M_start[1].field_0 + lVar3) = iVar6;
      *(int *)((long)&local_20._M_impl.super__Vector_impl_data._M_start[1].field_0 + lVar3 + 4) =
           iVar1 + 2 + iVar8;
      *(int *)((long)&local_20._M_impl.super__Vector_impl_data._M_start[1].field_0 + lVar3 + 8) =
           iVar9;
      lVar3 = lVar3 + 0x18;
    }
  }
  (*__glewBufferData)(0x8893,lVar5 * 0xc,local_20._M_impl.super__Vector_impl_data._M_start,0x88e8);
  index_count = lVar5 * 3;
  std::_Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>::
  ~_Vector_base(&local_20);
  return;
}

Assistant:

void regenerateIndices() {
    Perf stat("Regenerate indices");
    size_t n = 0;
    vector<ivec3> triangles(uint(phi_n * theta_n * 2));
    for (int phi_i = 0; phi_i < phi_n; phi_i++) {
        for (int theta_i = 0; theta_i < theta_n; theta_i++) {
            int tl = phi_i * (theta_n + 1) + theta_i;
            int tr = tl + 1;
            int bl = tr + theta_n;
            int br = bl + 1;
            triangles[n++] = ivec3(tr, tl, bl);
            triangles[n++] = ivec3(bl, br, tr);
        }
    }

    glBufferData(GL_ELEMENT_ARRAY_BUFFER, n * sizeof(ivec3), &triangles[0], GL_DYNAMIC_DRAW);

    index_count = n * 3;
}